

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetPropertyIdType(JsPropertyIdRef propertyId,JsPropertyIdType *propertyIdType)

{
  anon_class_16_2_1bf59473 fn;
  JsErrorCode JVar1;
  JsPropertyIdType *local_18;
  JsPropertyIdType *propertyIdType_local;
  JsPropertyIdRef propertyId_local;
  
  fn.propertyIdType = &local_18;
  fn.propertyId = &propertyIdType_local;
  local_18 = propertyIdType;
  propertyIdType_local = (JsPropertyIdType *)propertyId;
  JVar1 = GlobalAPIWrapper_NoRecord<JsGetPropertyIdType::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetPropertyIdType(_In_ JsPropertyIdRef propertyId, _Out_ JsPropertyIdType* propertyIdType)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_PROPERTYID(propertyId);

        Js::PropertyRecord const * propertyRecord = (Js::PropertyRecord const *)propertyId;

        if (propertyRecord->IsSymbol())
        {
            *propertyIdType = JsPropertyIdTypeSymbol;
        }
        else
        {
            *propertyIdType = JsPropertyIdTypeString;
        }
        return JsNoError;
    });
}